

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseNumber(State *state,int *number_out)

{
  bool bVar1;
  int local_34;
  char *pcStack_30;
  int number;
  char *p;
  int sign;
  int *number_out_local;
  State *state_local;
  
  p._4_4_ = 1;
  bVar1 = ParseOneCharToken(state,'n');
  if (bVar1) {
    p._4_4_ = -1;
  }
  pcStack_30 = state->mangled_cur;
  local_34 = 0;
  while ((*pcStack_30 != '\0' && (bVar1 = IsDigit(*pcStack_30), bVar1))) {
    local_34 = local_34 * 10 + *pcStack_30 + -0x30;
    pcStack_30 = pcStack_30 + 1;
  }
  if (pcStack_30 == state->mangled_cur) {
    state_local._7_1_ = false;
  }
  else {
    state->mangled_cur = pcStack_30;
    if (number_out != (int *)0x0) {
      *number_out = local_34 * p._4_4_;
    }
    state_local._7_1_ = true;
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseNumber(State *state, int *number_out) {
  int sign = 1;
  if (ParseOneCharToken(state, 'n')) {
    sign = -1;
  }
  const char *p = state->mangled_cur;
  int number = 0;
  for (;*p != '\0'; ++p) {
    if (IsDigit(*p)) {
      number = number * 10 + (*p - '0');
    } else {
      break;
    }
  }
  if (p != state->mangled_cur) {  // Conversion succeeded.
    state->mangled_cur = p;
    if (number_out != NULL) {
      *number_out = number * sign;
    }
    return true;
  }
  return false;
}